

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualizer.cc
# Opt level: O3

Ptr __thiscall
features::Visualizer::draw_matches
          (Visualizer *this,ConstPtr *image1,ConstPtr *image2,Correspondences2D2D *matches)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  element_type *peVar5;
  element_type *peVar6;
  void *__s;
  uint uVar7;
  size_t __n;
  Image<unsigned_char> *__p;
  invalid_argument *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __n_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  ptrdiff_t _Num;
  size_t __n_01;
  ulong uVar8;
  pointer __src;
  pointer pCVar9;
  pointer __dest;
  int iVar10;
  pointer puVar11;
  pointer puVar12;
  undefined1 *puVar13;
  pointer __src_00;
  long lVar14;
  Ptr PVar15;
  
  peVar5 = (image1->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (((peVar5->super_TypedImageBase<unsigned_char>).super_ImageBase.c == 3) &&
     (peVar6 = (image2->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr, (peVar6->super_TypedImageBase<unsigned_char>).super_ImageBase.c == 3)) {
    iVar1 = (peVar5->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
    uVar2 = (peVar5->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
    iVar3 = (peVar6->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
    uVar4 = (peVar6->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
    uVar7 = uVar4;
    if ((int)uVar4 < (int)uVar2) {
      uVar7 = uVar2;
    }
    __p = (Image<unsigned_char> *)operator_new(0x30);
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_00129d08;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.w = iVar3 + iVar1;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.h = uVar7;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.c = 3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&(__p->super_TypedImageBase<unsigned_char>).data,
               (long)(int)((iVar3 + iVar1) * uVar7 * 3));
    *(Image<unsigned_char> **)this = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_char>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
    __s = *(void **)(*(long *)this + 0x18);
    __n_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)(*(long *)this + 0x20) - (long)__s);
    if (__n_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      memset(__s,0,(size_t)__n_00._M_pi);
      __n_00._M_pi = extraout_RDX;
    }
    if (0 < (int)uVar7) {
      peVar5 = (image2->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      __src_00 = (peVar5->super_TypedImageBase<unsigned_char>).data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      puVar11 = (pointer)0x0;
      if (__src_00 ==
          *(pointer *)
           ((long)&(peVar5->super_TypedImageBase<unsigned_char>).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data + 8)) {
        __src_00 = puVar11;
      }
      peVar5 = (image1->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      __src = (peVar5->super_TypedImageBase<unsigned_char>).data.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (__src == *(pointer *)
                    ((long)&(peVar5->super_TypedImageBase<unsigned_char>).data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + 8)) {
        __src = puVar11;
      }
      __dest = *(pointer *)(*(long *)this + 0x18);
      if (__dest == *(pointer *)(*(long *)this + 0x20)) {
        __dest = puVar11;
      }
      __n_01 = (size_t)(iVar1 * 3);
      __n = (long)iVar3 * 3;
      do {
        iVar10 = (int)puVar11;
        puVar11 = __src;
        if ((iVar10 < (int)uVar2) && (puVar11 = __src + __n_01, iVar1 != 0)) {
          memmove(__dest,__src,__n_01);
          __n_00._M_pi = extraout_RDX_00;
        }
        __src = puVar11;
        puVar12 = __src_00;
        if ((iVar10 < (int)uVar4) && (puVar12 = __src_00 + __n, iVar3 != 0)) {
          memmove(__dest + __n_01,__src_00,__n);
          __n_00._M_pi = extraout_RDX_01;
        }
        __dest = __dest + __n_01 + __n;
        puVar11 = (pointer)(ulong)(iVar10 + 1U);
        __src_00 = puVar12;
      } while (uVar7 != iVar10 + 1U);
    }
    pCVar9 = (matches->
             super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((matches->
        super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>).
        _M_impl.super__Vector_impl_data._M_finish != pCVar9) {
      puVar13 = (anonymous_namespace)::color_table;
      lVar14 = 0x18;
      uVar8 = 0;
      do {
        core::image::draw_line<unsigned_char>
                  (*(Image<unsigned_char> **)this,
                   (int)*(double *)((long)pCVar9->p1 + lVar14 + -0x18),
                   (int)*(double *)((long)pCVar9->p1 + lVar14 + -0x10),
                   (int)(*(double *)((long)pCVar9->p1 + lVar14 + -8) + (double)iVar1),
                   (int)*(double *)((long)pCVar9->p1 + lVar14),
                   puVar13 + (uVar8 / 3 & 0xfffffffffffffffc) * -9);
        uVar8 = uVar8 + 1;
        pCVar9 = (matches->
                 super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        puVar13 = puVar13 + 3;
        lVar14 = lVar14 + 0x20;
        __n_00._M_pi = extraout_RDX_02;
      } while (uVar8 < (ulong)((long)(matches->
                                     super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9 >> 5
                              ));
    }
    PVar15.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = __n_00._M_pi;
    PVar15.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar15.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Only 3-channel images allowed");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

core::ByteImage::Ptr
Visualizer::draw_matches (core::ByteImage::ConstPtr image1,
    core::ByteImage::ConstPtr image2,
    sfm::Correspondences2D2D const& matches)
{
    if (image1->channels() != 3 || image2->channels() != 3)
        throw std::invalid_argument("Only 3-channel images allowed");

    int const img1_width = image1->width();
    int const img1_height = image1->height();
    int const img2_width = image2->width();
    int const img2_height = image2->height();
    int const out_width = img1_width + img2_width;
    int const out_height = std::max(img1_height, img2_height);

    core::ByteImage::Ptr ret = core::ByteImage::create(out_width, out_height, 3);
    ret->fill(0);

    /* Copy images into output image. */
    unsigned char* out_ptr = ret->begin();
    unsigned char const* img1_ptr = image1->begin();
    unsigned char const* img2_ptr = image2->begin();
    for (int y = 0; y < out_height; ++y)
    {
        if (y < img1_height)
        {
            std::copy(img1_ptr, img1_ptr + img1_width * 3, out_ptr);
            img1_ptr += img1_width * 3;
        }
        out_ptr += img1_width * 3;
        if (y < img2_height)
        {
            std::copy(img2_ptr, img2_ptr + img2_width * 3, out_ptr);
            img2_ptr += img2_width * 3;
        }
        out_ptr += img2_width * 3;
    }

    /* Draw matches. */
    for (std::size_t i = 0; i < matches.size(); ++i)
    {
        core::image::draw_line(*ret, matches[i].p1[0], matches[i].p1[1],
            matches[i].p2[0] + img1_width, matches[i].p2[1],
            color_table[i % 12]);
    }

    return ret;
}